

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall LogMessage::Flush(LogMessage *this)

{
  ostream *poVar1;
  size_t __n;
  void *__ptr;
  LogMessage *in_RDI;
  size_t n;
  string s;
  string local_28 [40];
  
  poVar1 = stream(in_RDI);
  std::operator<<(poVar1,"\n");
  std::__cxx11::ostringstream::str();
  __n = std::__cxx11::string::size();
  __ptr = (void *)std::__cxx11::string::data();
  fwrite(__ptr,1,__n,_stderr);
  in_RDI->flushed_ = true;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Flush() {
    stream() << "\n";
    std::string s = str_.str();
    size_t n = s.size();
    if (fwrite(s.data(), 1, n, stderr) < n) {}  // shut up gcc
    flushed_ = true;
  }